

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_get_unique_default(char *unique_expr,lyd_node *list,char **dflt)

{
  int iVar1;
  bool bVar2;
  int_log_opts local_70;
  uint local_6c;
  int_log_opts prev_ilo;
  uint i;
  ly_set *r;
  ly_set *s;
  lyd_node *node;
  lyd_node *last;
  lys_tpdf *tpdf;
  lys_node_leaf *sleaf;
  lys_node *parent;
  ly_ctx *ctx;
  char **dflt_local;
  lyd_node *list_local;
  char *unique_expr_local;
  
  parent = (lys_node *)list->schema->module->ctx;
  tpdf = (lys_tpdf *)0x0;
  ctx = (ly_ctx *)dflt;
  dflt_local = (char **)list;
  list_local = (lyd_node *)unique_expr;
  if (((unique_expr == (char *)0x0) || (list == (lyd_node *)0x0)) || (dflt == (char **)0x0)) {
    __assert_fail("unique_expr && list && dflt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1894,
                  "int lyd_get_unique_default(const char *, struct lyd_node *, const char **)");
  }
  *dflt = (char *)0x0;
  iVar1 = resolve_descendant_schema_nodeid(unique_expr,list->schema->child,4,1,(lys_node **)&sleaf);
  if ((iVar1 == 0) && (sleaf != (lys_node_leaf *)0x0)) {
    tpdf = (lys_tpdf *)sleaf;
    if (sleaf->dflt == (char *)0x0) {
      if ((sleaf->flags & 0x40) == 0) {
        last = (lyd_node *)(sleaf->type).der;
        while( true ) {
          bVar2 = false;
          if (last != (lyd_node *)0x0) {
            bVar2 = (ctx->dict).hash_tab == (hash_table *)0x0;
          }
          if (!bVar2) break;
          (ctx->dict).hash_tab = *(hash_table **)&last[1].hash;
          last = (lyd_node *)last[1].schema;
        }
      }
    }
    else {
      (ctx->dict).hash_tab = (hash_table *)sleaf->dflt;
    }
    if ((ctx->dict).hash_tab == (hash_table *)0x0) {
      unique_expr_local._4_4_ = 0;
    }
    else {
      r = ly_set_new();
      for (sleaf = (lys_node_leaf *)lys_parent((lys_node *)tpdf);
          sleaf != (lys_node_leaf *)*dflt_local;
          sleaf = (lys_node_leaf *)lys_parent((lys_node *)sleaf)) {
        if ((sleaf->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          ly_log((ly_ctx *)parent,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x18b1);
          ly_set_free(r);
          return -1;
        }
        ly_set_add(r,sleaf,1);
      }
      ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_70,(ly_err_item **)0x0);
      node = (lyd_node *)dflt_local;
      for (local_6c = 0; local_6c < r->number; local_6c = local_6c + 1) {
        sleaf = (lys_node_leaf *)(r->set).s[local_6c];
        if (sleaf->nodetype == LYS_CONTAINER) {
          if (node != (lyd_node *)0x0) {
            _prev_ilo = lyd_find_path(node,sleaf->name);
            if ((_prev_ilo == (ly_set *)0x0) || (1 < _prev_ilo->number)) {
              ly_set_free(_prev_ilo);
              (ctx->dict).hash_tab = (hash_table *)0x0;
              break;
            }
            if (_prev_ilo->number == 0) {
              node = (lyd_node *)0x0;
            }
            else {
              node = *(_prev_ilo->set).d;
            }
            ly_set_free(_prev_ilo);
          }
          if ((sleaf->type).ext != (lys_ext_instance **)0x0) {
            (ctx->dict).hash_tab = (hash_table *)0x0;
            break;
          }
        }
        else if ((sleaf->nodetype == LYS_CHOICE) && (node != (lyd_node *)0x0)) {
          if (local_6c + 1 == r->number) {
            sleaf = (lys_node_leaf *)tpdf;
          }
          else {
            if ((((r->set).s[local_6c + 1]->nodetype == LYS_CASE) && (local_6c + 2 < r->number)) &&
               ((r->set).s[local_6c + 2]->nodetype == LYS_CHOICE)) {
              local_6c = local_6c + 1;
              goto LAB_001a5219;
            }
            sleaf = (lys_node_leaf *)(r->set).s[local_6c + 1];
          }
          s = (ly_set *)node->child;
          iVar1 = lyv_multicases((lyd_node *)0x0,(lys_node *)sleaf,(lyd_node **)&s,0,(lyd_node *)0x0
                                );
          if (iVar1 != 0) {
            (ctx->dict).hash_tab = (hash_table *)0x0;
            break;
          }
        }
LAB_001a5219:
      }
      ly_ilo_restore((ly_ctx *)0x0,local_70,(ly_err_item *)0x0,0);
      ly_set_free(r);
      unique_expr_local._4_4_ = 0;
    }
  }
  else {
    ly_log((ly_ctx *)parent,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x1899);
    unique_expr_local._4_4_ = -1;
  }
  return unique_expr_local._4_4_;
}

Assistant:

int
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list, const char **dflt)
{
    struct ly_ctx *ctx = list->schema->module->ctx;
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    struct ly_set *s, *r;
    unsigned int i;
    enum int_log_opts prev_ilo;

    assert(unique_expr && list && dflt);
    *dflt = NULL;

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT(ctx);
        return -1;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        *dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !(*dflt); tpdf = tpdf->type.der) {
            *dflt = tpdf->dflt;
        }
    }

    if (!(*dflt)) {
        return 0;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT(ctx);
            ly_set_free(s);
            return -1;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }

    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_path(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    *dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                *dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                *dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);
    ly_set_free(s);
    return 0;
}